

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

string * __thiscall
iutest::internal::
FormatForComparisonFailureMessage<std::filesystem::__cxx11::directory_entry,std::filesystem::__cxx11::directory_entry>
          (string *__return_storage_ptr__,internal *this,directory_entry *value,
          directory_entry *param_2)

{
  directory_entry *param_1_local;
  directory_entry *value_local;
  
  PrintToString<std::filesystem::__cxx11::directory_entry>
            (__return_storage_ptr__,(directory_entry *)this);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string FormatForComparisonFailureMessage(const T1& value, const T2& /*other_operand*/)
{
    return PrintToString(value);
}